

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biffseek(bifcxdef *ctx,int argc)

{
  long lVar1;
  FILE *__stream;
  undefined4 in_ESI;
  long in_RDI;
  long pos;
  osfildef *fp;
  undefined8 in_stack_ffffffffffffffd8;
  runcxdef *in_stack_ffffffffffffffe0;
  int *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  __stream = (FILE *)bif_get_file((bifcxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                                  in_stack_ffffffffffffffe8,(int *)in_stack_ffffffffffffffe0);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  fseek(__stream,*(long *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8),0);
  return;
}

Assistant:

void biffseek(bifcxdef *ctx, int argc)
{
    osfildef *fp;
    long      pos;

    /* get the file pointer */
    bifcntargs(ctx, 2, argc);
    fp = bif_get_file(ctx, (int *)0, 0);

    /* get the seek position, and seek there */
    pos = runpopnum(ctx->bifcxrun);
    osfseek(fp, pos, OSFSK_SET);
}